

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

int enet_peer_send(ENetPeer *peer,enet_uint8 channelID,ENetPacket *packet)

{
  enet_uint16 eVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ENetOutgoingCommand *pEVar5;
  ENetChannel *pEVar6;
  enet_uint16 *peVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 local_89;
  ENetList fragments;
  ENetProtocol local_62;
  
  if (peer->state != ENET_PEER_STATE_CONNECTED) {
    return -1;
  }
  uVar10 = CONCAT71(in_register_00000031,channelID) & 0xffffffff;
  if (peer->channelCount <= uVar10) {
    return -1;
  }
  uVar13 = packet->dataLength;
  if (peer->host->maximumPacketSize < uVar13) {
    return -1;
  }
  pEVar6 = peer->channels + uVar10;
  uVar10 = ((ulong)peer->mtu + (ulong)(peer->host->checksum == (ENetChecksumCallback)0x0) * 4) -
           0x22;
  if (uVar13 <= uVar10) {
    peVar7 = &local_62.acknowledge.receivedSentTime;
    if ((packet->flags & 3) == 2) {
      local_62.header.command = 'I';
    }
    else if (((packet->flags & 1) == 0) && (pEVar6->outgoingUnreliableSequenceNumber != 0xffff)) {
      local_62.header.command = '\a';
    }
    else {
      peVar7 = &local_62.acknowledge.receivedReliableSequenceNumber;
      local_62.header.command = 0x86;
    }
    uVar9 = (ushort)uVar13;
    *peVar7 = uVar9 << 8 | uVar9 >> 8;
    local_62.header.channelID = channelID;
    pEVar5 = enet_peer_queue_outgoing_command(peer,&local_62,packet,0,uVar9);
    return -(uint)(pEVar5 == (ENetOutgoingCommand *)0x0);
  }
  uVar3 = (uint)(((uVar13 + uVar10) - 1) / uVar10);
  if (0x100000 < uVar3) {
    return -1;
  }
  if ((packet->flags & 9) == 8) {
    eVar1 = pEVar6->outgoingUnreliableSequenceNumber;
    local_89 = 0xc;
    if (eVar1 != 0xffff) goto LAB_0010422c;
  }
  eVar1 = pEVar6->outgoingReliableSequenceNumber;
  local_89 = 0x88;
LAB_0010422c:
  enet_list_clear(&fragments);
  uVar11 = 0;
  uVar13 = 0;
  while( true ) {
    uVar12 = (uint)uVar13;
    uVar8 = packet->dataLength - uVar13;
    if (packet->dataLength < uVar13 || uVar8 == 0) {
      packet->referenceCount = packet->referenceCount + (ulong)uVar11;
      while (fragments.sentinel.next != &fragments.sentinel) {
        pEVar5 = (ENetOutgoingCommand *)enet_list_remove(fragments.sentinel.next);
        enet_peer_setup_outgoing_command(peer,pEVar5);
      }
      return 0;
    }
    pvVar4 = enet_malloc(0x68);
    if (pvVar4 == (void *)0x0) break;
    if (uVar8 < uVar10) {
      uVar10 = uVar8;
    }
    *(uint *)((long)pvVar4 + 0x20) = uVar12;
    uVar9 = (ushort)uVar10;
    *(ushort *)((long)pvVar4 + 0x24) = uVar9;
    *(ENetPacket **)((long)pvVar4 + 0x60) = packet;
    *(undefined1 *)((long)pvVar4 + 0x28) = local_89;
    *(enet_uint8 *)((long)pvVar4 + 0x29) = channelID;
    *(enet_uint16 *)((long)pvVar4 + 0x2c) = (eVar1 + 1) * 0x100 | (ushort)(eVar1 + 1) >> 8;
    *(ushort *)((long)pvVar4 + 0x2e) = uVar9 << 8 | uVar9 >> 8;
    *(uint *)((long)pvVar4 + 0x30) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    *(uint *)((long)pvVar4 + 0x34) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    uVar2 = (uint)packet->dataLength;
    *(uint *)((long)pvVar4 + 0x38) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    *(uint *)((long)pvVar4 + 0x3c) =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    enet_list_insert(&fragments.sentinel,pvVar4);
    uVar11 = uVar11 + 1;
    uVar13 = (ulong)(uVar12 + (int)uVar10);
  }
  while (fragments.sentinel.next != &fragments.sentinel) {
    pvVar4 = enet_list_remove(fragments.sentinel.next);
    enet_free(pvVar4);
  }
  return -1;
}

Assistant:

int
enet_peer_send (ENetPeer * peer, enet_uint8 channelID, ENetPacket * packet)
{
   ENetChannel * channel = & peer -> channels [channelID];
   ENetProtocol command;
   size_t fragmentLength;

   if (peer -> state != ENET_PEER_STATE_CONNECTED ||
       channelID >= peer -> channelCount ||
       packet -> dataLength > peer -> host -> maximumPacketSize)
     return -1;

   fragmentLength = peer -> mtu - sizeof (ENetProtocolHeader) - sizeof (ENetProtocolSendFragment);
   if (peer -> host -> checksum != NULL)
     fragmentLength -= sizeof(enet_uint32);

   if (packet -> dataLength > fragmentLength)
   {
      enet_uint32 fragmentCount = (packet -> dataLength + fragmentLength - 1) / fragmentLength,
             fragmentNumber,
             fragmentOffset;
      enet_uint8 commandNumber;
      enet_uint16 startSequenceNumber; 
      ENetList fragments;
      ENetOutgoingCommand * fragment;

      if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT)
        return -1;

      if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT)) == ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT &&
          channel -> outgoingUnreliableSequenceNumber < 0xFFFF)
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingUnreliableSequenceNumber + 1);
      }
      else
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_FRAGMENT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingReliableSequenceNumber + 1);
      }
        
      enet_list_clear (& fragments);

      for (fragmentNumber = 0,
             fragmentOffset = 0;
           fragmentOffset < packet -> dataLength;
           ++ fragmentNumber,
             fragmentOffset += fragmentLength)
      {
         if (packet -> dataLength - fragmentOffset < fragmentLength)
           fragmentLength = packet -> dataLength - fragmentOffset;

         fragment = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
         if (fragment == NULL)
         {
            while (! enet_list_empty (& fragments))
            {
               fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
               
               enet_free (fragment);
            }
            
            return -1;
         }
         
         fragment -> fragmentOffset = fragmentOffset;
         fragment -> fragmentLength = fragmentLength;
         fragment -> packet = packet;
         fragment -> command.header.command = commandNumber;
         fragment -> command.header.channelID = channelID;
         fragment -> command.sendFragment.startSequenceNumber = startSequenceNumber;
         fragment -> command.sendFragment.dataLength = ENET_HOST_TO_NET_16 (fragmentLength);
         fragment -> command.sendFragment.fragmentCount = ENET_HOST_TO_NET_32 (fragmentCount);
         fragment -> command.sendFragment.fragmentNumber = ENET_HOST_TO_NET_32 (fragmentNumber);
         fragment -> command.sendFragment.totalLength = ENET_HOST_TO_NET_32 (packet -> dataLength);
         fragment -> command.sendFragment.fragmentOffset = ENET_NET_TO_HOST_32 (fragmentOffset);
        
         enet_list_insert (enet_list_end (& fragments), fragment);
      }

      packet -> referenceCount += fragmentNumber;

      while (! enet_list_empty (& fragments))
      {
         fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
 
         enet_peer_setup_outgoing_command (peer, fragment);
      }

      return 0;
   }

   command.header.channelID = channelID;

   if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNSEQUENCED)) == ENET_PACKET_FLAG_UNSEQUENCED)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
      command.sendUnsequenced.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else 
   if (packet -> flags & ENET_PACKET_FLAG_RELIABLE || channel -> outgoingUnreliableSequenceNumber >= 0xFFFF)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_RELIABLE | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
      command.sendReliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE;
      command.sendUnreliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }

   if (enet_peer_queue_outgoing_command (peer, & command, packet, 0, packet -> dataLength) == NULL)
     return -1;

   return 0;
}